

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# obj2pbrt.cpp
# Opt level: O0

void __thiscall tinyobj::MaterialFileReader::~MaterialFileReader(MaterialFileReader *this)

{
  MaterialFileReader *in_RDI;
  
  ~MaterialFileReader(in_RDI);
  operator_delete(in_RDI,0x28);
  return;
}

Assistant:

virtual ~MaterialFileReader() {}